

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2Bug18458852(void)

{
  char b [18];
  RE2 re;
  char local_288 [32];
  RE2 local_268;
  LogMessage local_188;
  
  local_288[0] = '(';
  local_288[1] = '\x05';
  local_288[2] = '\x05';
  local_288[3] = 'A';
  local_288[4] = 'A';
  local_288[5] = '(';
  local_288[6] = '$';
  local_288[7] = '[';
  local_288[8] = '^';
  local_288[9] = -0xb;
  local_288[10] = -0x79;
  local_288[0xb] = -0x79;
  local_288[0xc] = -0x70;
  local_288[0xd] = ')';
  local_288[0xe] = ']';
  local_288[0xf] = ')';
  local_288[0x10] = ')';
  local_288[0x11] = '\0';
  RE2::RE2(&local_268,local_288);
  if (local_268.error_code_ == NoError) {
    LogMessage::LogMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x606,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188.str_,"Check failed: !re.ok()",0x16);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_188);
  }
  RE2::~RE2(&local_268);
  return;
}

Assistant:

TEST(RE2, Bug18458852) {
  // Bug in parser accepting invalid (too large) rune,
  // causing compiler to fail in DCHECK in UTF-8
  // character class code.
  const char b[] = {
      (char)0x28, (char)0x05, (char)0x05, (char)0x41, (char)0x41, (char)0x28,
      (char)0x24, (char)0x5b, (char)0x5e, (char)0xf5, (char)0x87, (char)0x87,
      (char)0x90, (char)0x29, (char)0x5d, (char)0x29, (char)0x29, (char)0x00,
  };
  RE2 re(b);
  CHECK(!re.ok());
}